

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImGuiMetricsConfig *pIVar1;
  bool *pbVar2;
  ImVec2 IVar3;
  int iVar4;
  ImGuiViewportP *pIVar5;
  ImGuiWindow *pIVar6;
  ImGuiPopupData *pIVar7;
  undefined8 *puVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  bool bVar13;
  ImGuiContext *g;
  ImDrawList *pIVar14;
  ImU32 col;
  long lVar15;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  char *pcVar19;
  int rect_n;
  ImGuiTable *pIVar20;
  ImGuiWindowSettings *settings;
  ImGuiTableSettings *settings_00;
  int draw_list_i;
  long lVar21;
  undefined **ppuVar22;
  char **ppcVar23;
  char *pcVar24;
  int column_n;
  uint uVar25;
  int iVar26;
  long lVar27;
  int i_1;
  ImVector<ImDrawList_*> *pIVar28;
  int viewport_i;
  int rect_n_1;
  ulong uVar29;
  byte bVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  float fVar34;
  float fVar35;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined1 auVar38 [16];
  ImRect IVar39;
  ImVec2 local_1d0;
  int *local_1c8;
  int *local_1c0;
  ImGuiMetricsConfig *local_1b8;
  ImVec2 local_1b0;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined8 local_188;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  char buf [128];
  char *wrt_rects_names [8];
  char *trt_rects_names [13];
  
  bVar30 = 0;
  bVar13 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  pIVar11 = GImGui;
  if (!bVar13) {
    End();
    return;
  }
  Text("Dear ImGui %s","1.81");
  fVar34 = (pIVar11->IO).Framerate;
  Text("Application average %.3f ms/frame (%.1f FPS)",SUB84((double)(1000.0 / fVar34),0),
       SUB84((double)fVar34,0));
  uVar25 = (pIVar11->IO).MetricsRenderIndices;
  Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar11->IO).MetricsRenderVertices,
       (ulong)uVar25,(long)(int)uVar25 / 3 & 0xffffffff);
  Text("%d active windows (%d visible)",(ulong)(uint)(pIVar11->IO).MetricsActiveWindows,
       (ulong)(uint)(pIVar11->IO).MetricsRenderWindows);
  Text("%d active allocations",(ulong)(uint)(pIVar11->IO).MetricsActiveAllocations);
  Separator();
  wrt_rects_names[6] = "ContentIdeal";
  wrt_rects_names[7] = "ContentRegionRect";
  wrt_rects_names[4] = "WorkRect";
  wrt_rects_names[5] = "Content";
  wrt_rects_names[2] = "InnerRect";
  wrt_rects_names[3] = "InnerClipRect";
  wrt_rects_names[0] = "OuterRect";
  wrt_rects_names[1] = "OuterRectClipped";
  ppuVar22 = &PTR_anon_var_dwarf_30193_0019e560;
  ppcVar23 = trt_rects_names;
  for (lVar15 = 0xd; lVar15 != 0; lVar15 = lVar15 + -1) {
    *ppcVar23 = *ppuVar22;
    ppuVar22 = ppuVar22 + (ulong)bVar30 * -2 + 1;
    ppcVar23 = ppcVar23 + (ulong)bVar30 * -2 + 1;
  }
  local_1c0 = &(pIVar11->DebugMetricsConfig).ShowWindowsRectsType;
  if ((pIVar11->DebugMetricsConfig).ShowWindowsRectsType < 0) {
    *local_1c0 = 4;
  }
  local_1c8 = &(pIVar11->DebugMetricsConfig).ShowTablesRectsType;
  if ((pIVar11->DebugMetricsConfig).ShowTablesRectsType < 0) {
    *local_1c8 = 2;
  }
  local_1b8 = &pIVar11->DebugMetricsConfig;
  bVar13 = TreeNode("Tools");
  if (bVar13) {
    auVar10._8_8_ = 0;
    auVar10[0] = buf[8];
    auVar10[1] = buf[9];
    auVar10[2] = buf[10];
    auVar10[3] = buf[0xb];
    auVar10[4] = buf[0xc];
    auVar10[5] = buf[0xd];
    auVar10[6] = buf[0xe];
    auVar10[7] = buf[0xf];
    buf._0_16_ = auVar10 << 0x40;
    bVar13 = Button("Item Picker..",(ImVec2 *)buf);
    if (bVar13) {
      GImGui->DebugItemPickerActive = true;
    }
    SameLine(0.0,-1.0);
    TextDisabled("(?)");
    bVar13 = IsItemHovered(0);
    if (bVar13) {
      BeginTooltip();
      PushTextWrapPos(GImGui->FontSize * 35.0);
      TextUnformatted("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                      ,(char *)0x0);
      PopTextWrapPos();
      End();
    }
    Checkbox("Show windows begin order",&(pIVar11->DebugMetricsConfig).ShowWindowsBeginOrder);
    Checkbox("Show windows rectangles",&local_1b8->ShowWindowsRects);
    SameLine(0.0,-1.0);
    pIVar12 = GImGui;
    fVar34 = GImGui->FontSize;
    (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
    (pIVar12->NextItemData).Width = fVar34 * 12.0;
    bVar13 = Combo("##show_windows_rect_type",local_1c0,wrt_rects_names,8,8);
    pIVar1 = &pIVar11->DebugMetricsConfig;
    pIVar1->ShowWindowsRects = (bool)(pIVar1->ShowWindowsRects | bVar13);
    if ((pIVar1->ShowWindowsRects != false) && (pIVar11->NavWindow != (ImGuiWindow *)0x0)) {
      BulletText("\'%s\':",pIVar11->NavWindow->Name);
      Indent(0.0);
      for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
        IVar39 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar11->NavWindow,(int)lVar15);
        Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",SUB84((double)IVar39.Min.x,0),
             SUB84((double)IVar39.Min.y,0),(double)IVar39.Max.x,SUB84((double)IVar39.Max.y,0),
             SUB84((double)(IVar39.Max.x - IVar39.Min.x),0),(double)(IVar39.Max.y - IVar39.Min.y),
             wrt_rects_names[lVar15]);
      }
      Unindent(0.0);
    }
    Checkbox("Show ImDrawCmd mesh when hovering",&(pIVar11->DebugMetricsConfig).ShowDrawCmdMesh);
    Checkbox("Show ImDrawCmd bounding boxes when hovering",
             &(pIVar11->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
    Checkbox("Show tables rectangles",&(pIVar11->DebugMetricsConfig).ShowTablesRects);
    uVar36 = 0;
    uVar37 = 0;
    SameLine(0.0,-1.0);
    pIVar12 = GImGui;
    fVar34 = GImGui->FontSize;
    (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
    (pIVar12->NextItemData).Width = fVar34 * 12.0;
    bVar13 = Combo("##show_table_rects_type",local_1c8,trt_rects_names,0xd,0xd);
    pbVar2 = &(pIVar11->DebugMetricsConfig).ShowTablesRects;
    *pbVar2 = (bool)(*pbVar2 | bVar13);
    if ((*pbVar2 != false) && (pIVar11->NavWindow != (ImGuiWindow *)0x0)) {
      for (lVar15 = 0; lVar15 < (pIVar11->Tables).Buf.Size; lVar15 = lVar15 + 1) {
        pIVar20 = (pIVar11->Tables).Buf.Data;
        if (pIVar11->FrameCount + -1 <= pIVar20[lVar15].LastFrameActive) {
          pIVar20 = pIVar20 + lVar15;
          if ((pIVar20->OuterWindow == pIVar11->NavWindow) ||
             (pIVar20->InnerWindow == pIVar11->NavWindow)) {
            local_188 = lVar15;
            BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)pIVar20->ID,
                       (ulong)(uint)pIVar20->ColumnsCount);
            bVar13 = IsItemHovered(0);
            if (bVar13) {
              pIVar14 = GetForegroundDrawList();
              auVar10 = buf._0_16_;
              IVar3 = (pIVar20->OuterRect).Min;
              buf._4_4_ = IVar3.y + -1.0;
              buf._0_4_ = IVar3.x + -1.0;
              buf._8_8_ = auVar10._8_8_;
              IVar3 = (pIVar20->OuterRect).Max;
              local_1d0.y = IVar3.y + 1.0;
              local_1d0.x = IVar3.x + 1.0;
              uVar36 = 0;
              uVar37 = 0;
              ImDrawList::AddRect(pIVar14,(ImVec2 *)buf,&local_1d0,0xff00ffff,0.0,-1,2.0);
            }
            Indent(0.0);
            for (uVar29 = 0; uVar29 != 0xd; uVar29 = uVar29 + 1) {
              iVar26 = (int)uVar29;
              if (uVar29 < 6) {
                IVar39 = ShowMetricsWindow::Funcs::GetTableRect(pIVar20,iVar26,-1);
                fStack_1a0 = (float)uVar36;
                local_1a8._0_4_ = IVar39.Max.x;
                local_1a8._4_4_ = IVar39.Max.y;
                fStack_19c = (float)uVar37;
                local_198._8_4_ = extraout_XMM0_Dc_00;
                local_198._0_4_ = IVar39.Min.x;
                local_198._4_4_ = IVar39.Min.y;
                local_198._12_4_ = extraout_XMM0_Dd_00;
                ImFormatString(buf,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",
                               SUB84((double)IVar39.Min.x,0),SUB84((double)IVar39.Min.y,0),
                               (double)IVar39.Max.x,SUB84((double)IVar39.Max.y,0),
                               SUB84((double)(IVar39.Max.x - IVar39.Min.x),0),
                               (double)(IVar39.Max.y - IVar39.Min.y),trt_rects_names[uVar29]);
                local_1d0.x = 0.0;
                local_1d0.y = 0.0;
                Selectable(buf,false,0,&local_1d0);
                bVar13 = IsItemHovered(0);
                if (bVar13) {
                  pIVar14 = GetForegroundDrawList();
                  local_1d0.y = (float)local_198._4_4_ + -1.0;
                  local_1d0.x = (float)local_198._0_4_ + -1.0;
                  local_1b0.y = (float)local_1a8._4_4_ + 1.0;
                  local_1b0.x = (float)local_1a8._0_4_ + 1.0;
                  uVar36 = 0;
                  uVar37 = 0;
                  ImDrawList::AddRect(pIVar14,&local_1d0,&local_1b0,0xff00ffff,0.0,-1,2.0);
                }
              }
              else if ((iVar26 == 8) || (iVar26 == 6)) {
                for (uVar25 = 0; (int)uVar25 < pIVar20->ColumnsCount; uVar25 = uVar25 + 1) {
                  IVar39 = ShowMetricsWindow::Funcs::GetTableRect(pIVar20,iVar26,uVar25);
                  fStack_1a0 = (float)uVar36;
                  local_1a8._0_4_ = IVar39.Max.x;
                  local_1a8._4_4_ = IVar39.Max.y;
                  fStack_19c = (float)uVar37;
                  local_198._8_4_ = extraout_XMM0_Dc;
                  local_198._0_4_ = IVar39.Min.x;
                  local_198._4_4_ = IVar39.Min.y;
                  local_198._12_4_ = extraout_XMM0_Dd;
                  ImFormatString(buf,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s"
                                 ,SUB84((double)IVar39.Min.x,0),SUB84((double)IVar39.Min.y,0),
                                 (double)IVar39.Max.x,SUB84((double)IVar39.Max.y,0),
                                 SUB84((double)(IVar39.Max.x - IVar39.Min.x),0),
                                 (double)(IVar39.Max.y - IVar39.Min.y),(ulong)uVar25,
                                 trt_rects_names[uVar29]);
                  local_1d0.x = 0.0;
                  local_1d0.y = 0.0;
                  Selectable(buf,false,0,&local_1d0);
                  bVar13 = IsItemHovered(0);
                  if (bVar13) {
                    pIVar14 = GetForegroundDrawList();
                    local_1d0.y = (float)local_198._4_4_ + -1.0;
                    local_1d0.x = (float)local_198._0_4_ + -1.0;
                    local_1b0.y = (float)local_1a8._4_4_ + 1.0;
                    local_1b0.x = (float)local_1a8._0_4_ + 1.0;
                    uVar36 = 0;
                    uVar37 = 0;
                    ImDrawList::AddRect(pIVar14,&local_1d0,&local_1b0,0xff00ffff,0.0,-1,2.0);
                  }
                }
              }
            }
            Unindent(0.0);
            lVar15 = local_188;
          }
        }
      }
    }
    TreePop();
  }
  local_198._0_8_ = &pIVar11->Windows;
  DebugNodeWindowsList(&pIVar11->Windows,"Windows");
  uVar25 = (pIVar11->Viewports).Size;
  uVar16 = 0;
  uVar29 = (ulong)uVar25;
  if ((int)uVar25 < 1) {
    uVar29 = uVar16;
  }
  uVar18 = 0;
  for (; uVar29 != uVar16; uVar16 = uVar16 + 1) {
    pIVar5 = (pIVar11->Viewports).Data[uVar16];
    uVar18 = (ulong)(uint)((int)uVar18 + (pIVar5->DrawDataBuilder).Layers[1].Size +
                          (pIVar5->DrawDataBuilder).Layers[0].Size);
  }
  bVar13 = TreeNode("DrawLists","DrawLists (%d)",uVar18);
  if (bVar13) {
    for (lVar15 = 0; lVar15 < (pIVar11->Viewports).Size; lVar15 = lVar15 + 1) {
      pIVar5 = (pIVar11->Viewports).Data[lVar15];
      for (lVar27 = 0; lVar27 != 2; lVar27 = lVar27 + 1) {
        pIVar28 = (pIVar5->DrawDataBuilder).Layers + lVar27;
        for (lVar21 = 0; lVar21 < pIVar28->Size; lVar21 = lVar21 + 1) {
          DebugNodeDrawList((ImGuiWindow *)0x0,pIVar28->Data[lVar21],"DrawList");
        }
      }
    }
    TreePop();
  }
  bVar13 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)(pIVar11->Viewports).Size);
  if (bVar13) {
    fVar34 = GetTreeNodeToLabelSpacing();
    Indent(fVar34);
    pIVar12 = GImGui;
    pIVar6 = GImGui->CurrentWindow;
    _local_1a8 = _DAT_0017b980;
    for (lVar15 = 0; uVar29 = (ulong)(pIVar12->Viewports).Size, lVar15 < (long)uVar29;
        lVar15 = lVar15 + 1) {
      IVar39 = ImGuiViewportP::GetMainRect((pIVar12->Viewports).Data[lVar15]);
      uVar32 = -(uint)(IVar39.Min.y < fStack_1a0);
      uVar33 = -(uint)(IVar39.Min.x < fStack_19c);
      uVar25 = -(uint)((float)local_1a8._0_4_ < IVar39.Max.y);
      uVar31 = -(uint)((float)local_1a8._4_4_ < IVar39.Max.x);
      auVar38._0_4_ = ~uVar25 & local_1a8._0_4_;
      auVar38._4_4_ = ~uVar31 & local_1a8._4_4_;
      auVar38._8_4_ = ~uVar32 & (uint)fStack_1a0;
      auVar38._12_4_ = ~uVar33 & (uint)fStack_19c;
      auVar9._4_4_ = (uint)IVar39.Max.x & uVar31;
      auVar9._0_4_ = (uint)IVar39.Max.y & uVar25;
      auVar9._8_4_ = (uint)IVar39.Min.y & uVar32;
      auVar9._12_4_ = (uint)IVar39.Min.x & uVar33;
      _local_1a8 = auVar38 | auVar9;
    }
    IVar3 = (pIVar6->DC).CursorPos;
    fVar34 = local_1a8._8_4_;
    fVar35 = local_1a8._12_4_;
    local_178._8_4_ = fVar34;
    local_178._0_8_ = local_1a8._8_8_;
    local_178._12_4_ = fVar35;
    local_168 = 0.125;
    fStack_164 = 0.125;
    uStack_160 = 0;
    uStack_15c = 0;
    fStack_180 = 0.0 - fVar34 * 0.0;
    fStack_17c = 0.0 - fVar35 * 0.0;
    local_188 = CONCAT44(IVar3.y - fVar34 * 0.125,IVar3.x - fVar35 * 0.125);
    for (lVar15 = 0; lVar15 < (int)uVar29; lVar15 = lVar15 + 1) {
      pIVar5 = (pIVar12->Viewports).Data[lVar15];
      IVar3 = (pIVar5->super_ImGuiViewport).Pos;
      fVar34 = IVar3.x;
      fVar35 = IVar3.y;
      IVar3 = (pIVar5->super_ImGuiViewport).Size;
      buf._4_4_ = fVar35 * 0.125 + local_188._4_4_;
      buf._0_4_ = fVar34 * 0.125 + (float)local_188;
      buf._8_4_ = (IVar3.x + fVar34) * 0.125 + (float)local_188;
      buf._12_4_ = (IVar3.y + fVar35) * 0.125 + local_188._4_4_;
      DebugRenderViewportThumbnail(pIVar6->DrawList,pIVar5,(ImRect *)buf);
      uVar29 = (ulong)(uint)(pIVar12->Viewports).Size;
    }
    buf._4_4_ = ((float)local_1a8._0_4_ - (float)local_178._0_4_) * fStack_164;
    buf._0_4_ = ((float)local_1a8._4_4_ - (float)local_178._4_4_) * local_168;
    Dummy((ImVec2 *)buf);
    fVar34 = GetTreeNodeToLabelSpacing();
    Unindent(fVar34);
    for (lVar15 = 0; lVar15 < (pIVar11->Viewports).Size; lVar15 = lVar15 + 1) {
      DebugNodeViewport((pIVar11->Viewports).Data[lVar15]);
    }
    TreePop();
  }
  bVar13 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar11->OpenPopupStack).Size);
  if (bVar13) {
    lVar15 = 8;
    for (lVar27 = 0; lVar27 < (pIVar11->OpenPopupStack).Size; lVar27 = lVar27 + 1) {
      pIVar7 = (pIVar11->OpenPopupStack).Data;
      puVar8 = *(undefined8 **)((long)&pIVar7->PopupId + lVar15);
      pcVar17 = "";
      pcVar19 = "NULL";
      pcVar24 = "";
      if (puVar8 != (undefined8 *)0x0) {
        pcVar19 = (char *)*puVar8;
        pcVar17 = " ChildWindow";
        if ((*(uint *)((long)puVar8 + 0xc) >> 0x18 & 1) == 0) {
          pcVar17 = "";
        }
        pcVar24 = " ChildMenu";
        if ((*(uint *)((long)puVar8 + 0xc) >> 0x1c & 1) == 0) {
          pcVar24 = "";
        }
      }
      BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)*(uint *)((long)pIVar7 + lVar15 + -8),
                 pcVar19,pcVar17,pcVar24);
      lVar15 = lVar15 + 0x30;
    }
    TreePop();
  }
  bVar13 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar11->TabBars).Buf.Size);
  if (bVar13) {
    lVar15 = 0;
    for (lVar27 = 0; lVar27 < (pIVar11->TabBars).Buf.Size; lVar27 = lVar27 + 1) {
      DebugNodeTabBar((ImGuiTabBar *)((long)&(((pIVar11->TabBars).Buf.Data)->Tabs).Size + lVar15),
                      "TabBar");
      lVar15 = lVar15 + 0x98;
    }
    TreePop();
  }
  bVar13 = TreeNode("Tables","Tables (%d)",(ulong)(uint)(pIVar11->Tables).Buf.Size);
  if (bVar13) {
    lVar15 = 0;
    for (lVar27 = 0; lVar27 < (pIVar11->Tables).Buf.Size; lVar27 = lVar27 + 1) {
      DebugNodeTable((ImGuiTable *)((long)&((pIVar11->Tables).Buf.Data)->ID + lVar15));
      lVar15 = lVar15 + 600;
    }
    TreePop();
  }
  bVar13 = TreeNode("Settings");
  if (bVar13) {
    bVar13 = SmallButton("Clear");
    if (bVar13) {
      ClearIniSettings();
    }
    SameLine(0.0,-1.0);
    bVar13 = SmallButton("Save to memory");
    if (bVar13) {
      SaveIniSettingsToMemory((size_t *)0x0);
    }
    SameLine(0.0,-1.0);
    bVar13 = SmallButton("Save to disk");
    if (bVar13) {
      SaveIniSettingsToDisk((pIVar11->IO).IniFilename);
    }
    SameLine(0.0,-1.0);
    if ((pIVar11->IO).IniFilename == (char *)0x0) {
      TextUnformatted("<NULL>",(char *)0x0);
    }
    else {
      Text("\"%s\"");
    }
    Text("SettingsDirtyTimer %.2f",SUB84((double)pIVar11->SettingsDirtyTimer,0));
    bVar13 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                      (ulong)(uint)(pIVar11->SettingsHandlers).Size);
    if (bVar13) {
      lVar15 = 0;
      for (lVar27 = 0; lVar27 < (pIVar11->SettingsHandlers).Size; lVar27 = lVar27 + 1) {
        BulletText("%s",*(undefined8 *)
                         ((long)&((pIVar11->SettingsHandlers).Data)->TypeName + lVar15));
        lVar15 = lVar15 + 0x48;
      }
      TreePop();
    }
    bVar13 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                      (ulong)(uint)(pIVar11->SettingsWindows).Buf.Size);
    if (bVar13) {
      pcVar19 = (pIVar11->SettingsWindows).Buf.Data;
      settings = (ImGuiWindowSettings *)(pcVar19 + 4);
      if (pcVar19 == (char *)0x0) {
        settings = (ImGuiWindowSettings *)0x0;
      }
      while (settings != (ImGuiWindowSettings *)0x0) {
        DebugNodeWindowSettings(settings);
        iVar26._0_1_ = settings[-1].Collapsed;
        iVar26._1_1_ = settings[-1].WantApply;
        iVar26._2_2_ = *(undefined2 *)&settings[-1].field_0xe;
        settings = (ImGuiWindowSettings *)((long)&settings->ID + (long)iVar26);
        if (settings ==
            (ImGuiWindowSettings *)
            ((pIVar11->SettingsWindows).Buf.Data + (long)(pIVar11->SettingsWindows).Buf.Size + 4)) {
          settings = (ImGuiWindowSettings *)0x0;
        }
      }
      TreePop();
    }
    bVar13 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",
                      (ulong)(uint)(pIVar11->SettingsTables).Buf.Size);
    if (bVar13) {
      pcVar19 = (pIVar11->SettingsTables).Buf.Data;
      settings_00 = (ImGuiTableSettings *)(pcVar19 + 4);
      if (pcVar19 == (char *)0x0) {
        settings_00 = (ImGuiTableSettings *)0x0;
      }
      while (settings_00 != (ImGuiTableSettings *)0x0) {
        DebugNodeTableSettings(settings_00);
        iVar4._0_1_ = settings_00[-1].ColumnsCount;
        iVar4._1_1_ = settings_00[-1].ColumnsCountMax;
        iVar4._2_1_ = settings_00[-1].WantApply;
        iVar4._3_1_ = settings_00[-1].field_0xf;
        settings_00 = (ImGuiTableSettings *)((long)&settings_00->ID + (long)iVar4);
        if (settings_00 ==
            (ImGuiTableSettings *)
            ((pIVar11->SettingsTables).Buf.Data + (long)(pIVar11->SettingsTables).Buf.Size + 4)) {
          settings_00 = (ImGuiTableSettings *)0x0;
        }
      }
      TreePop();
    }
    iVar26 = (pIVar11->SettingsIniData).Buf.Size;
    uVar29 = (ulong)(iVar26 - 1);
    if (iVar26 == 0) {
      uVar29 = 0;
    }
    bVar13 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar29);
    if (bVar13) {
      pcVar19 = (pIVar11->SettingsIniData).Buf.Data;
      if (pcVar19 == (char *)0x0) {
        pcVar19 = ImGuiTextBuffer::EmptyString;
      }
      buf._4_4_ = GImGui->FontSize * 20.0;
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = -0x80;
      buf[3] = -0x80;
      InputTextMultiline("##Ini",pcVar19,(long)(pIVar11->SettingsIniData).Buf.Size,(ImVec2 *)buf,
                         0x4000,(ImGuiInputTextCallback)0x0,(void *)0x0);
      TreePop();
    }
    TreePop();
  }
  bVar13 = TreeNode("Internal state");
  if (bVar13) {
    pcVar17 = "NULL";
    Text("WINDOWING");
    Indent(0.0);
    pcVar19 = "NULL";
    if (pIVar11->HoveredWindow != (ImGuiWindow *)0x0) {
      pcVar19 = pIVar11->HoveredWindow->Name;
    }
    Text("HoveredWindow: \'%s\'",pcVar19);
    pcVar19 = "NULL";
    if (pIVar11->HoveredRootWindow != (ImGuiWindow *)0x0) {
      pcVar19 = pIVar11->HoveredRootWindow->Name;
    }
    Text("HoveredRootWindow: \'%s\'",pcVar19);
    pcVar19 = "NULL";
    if (pIVar11->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
      pcVar19 = pIVar11->HoveredWindowUnderMovingWindow->Name;
    }
    Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar19);
    pcVar19 = "NULL";
    if (pIVar11->MovingWindow != (ImGuiWindow *)0x0) {
      pcVar19 = pIVar11->MovingWindow->Name;
    }
    Text("MovingWindow: \'%s\'",pcVar19);
    Unindent(0.0);
    Text("ITEMS");
    Indent(0.0);
    Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
         SUB84((double)pIVar11->ActiveIdTimer,0),(ulong)pIVar11->ActiveId,
         (ulong)pIVar11->ActiveIdPreviousFrame,(ulong)pIVar11->ActiveIdAllowOverlap,
         *(undefined8 *)(&DAT_0019e5d0 + (ulong)pIVar11->ActiveIdSource * 8));
    pcVar19 = "NULL";
    if (pIVar11->ActiveIdWindow != (ImGuiWindow *)0x0) {
      pcVar19 = pIVar11->ActiveIdWindow->Name;
    }
    Text("ActiveIdWindow: \'%s\'",pcVar19);
    Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",
         SUB84((double)pIVar11->HoveredIdTimer,0),(ulong)pIVar11->HoveredId,
         (ulong)pIVar11->HoveredIdPreviousFrame,(ulong)pIVar11->HoveredIdAllowOverlap);
    Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",(ulong)pIVar11->DragDropActive
         ,(ulong)(pIVar11->DragDropPayload).SourceId,(pIVar11->DragDropPayload).DataType,
         (ulong)(uint)(pIVar11->DragDropPayload).DataSize);
    Unindent(0.0);
    Text("NAV,FOCUS");
    Indent(0.0);
    pcVar19 = "NULL";
    if (pIVar11->NavWindow != (ImGuiWindow *)0x0) {
      pcVar19 = pIVar11->NavWindow->Name;
    }
    Text("NavWindow: \'%s\'",pcVar19);
    Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar11->NavId,(ulong)pIVar11->NavLayer);
    Text("NavInputSource: %s",*(undefined8 *)(&DAT_0019e5d0 + (ulong)pIVar11->NavInputSource * 8));
    Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar11->IO).NavActive,
         (ulong)(pIVar11->IO).NavVisible);
    Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar11->NavActivateId,
         (ulong)pIVar11->NavInputId);
    Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar11->NavDisableHighlight,
         (ulong)pIVar11->NavDisableMouseHover);
    Text("NavFocusScopeId = 0x%08X",(ulong)pIVar11->NavFocusScopeId);
    if (pIVar11->NavWindowingTarget != (ImGuiWindow *)0x0) {
      pcVar17 = pIVar11->NavWindowingTarget->Name;
    }
    Text("NavWindowingTarget: \'%s\'",pcVar17);
    Unindent(0.0);
    TreePop();
  }
  if ((local_1b8->ShowWindowsRects != false) ||
     ((pIVar11->DebugMetricsConfig).ShowWindowsBeginOrder == true)) {
    for (lVar15 = 0; lVar15 < *(int *)local_198._0_8_; lVar15 = lVar15 + 1) {
      pIVar6 = (pIVar11->Windows).Data[lVar15];
      if (pIVar6->WasActive == true) {
        pIVar14 = GetForegroundDrawList();
        if (local_1b8->ShowWindowsRects == true) {
          buf._0_16_ = (undefined1  [16])ShowMetricsWindow::Funcs::GetWindowRect(pIVar6,*local_1c0);
          ImDrawList::AddRect(pIVar14,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0xf,1.0);
        }
        if (((pIVar11->DebugMetricsConfig).ShowWindowsBeginOrder == true) &&
           ((pIVar6->Flags & 0x1000000) == 0)) {
          ImFormatString(buf,0x20,"%d",(ulong)(uint)(int)pIVar6->BeginOrderWithinContext);
          local_1d0.y = GImGui->FontSize + (pIVar6->Pos).y;
          local_1d0.x = GImGui->FontSize + (pIVar6->Pos).x;
          ImDrawList::AddRectFilled(pIVar14,&pIVar6->Pos,&local_1d0,0xff6464c8,0.0,0xf);
          ImDrawList::AddText(pIVar14,&pIVar6->Pos,0xffffffff,buf,(char *)0x0);
        }
      }
    }
  }
  if ((pIVar11->DebugMetricsConfig).ShowTablesRects == true) {
    for (lVar15 = 0; lVar15 < (pIVar11->Tables).Buf.Size; lVar15 = lVar15 + 1) {
      pIVar20 = (pIVar11->Tables).Buf.Data;
      if (pIVar11->FrameCount + -1 <= pIVar20[lVar15].LastFrameActive) {
        pIVar20 = pIVar20 + lVar15;
        pIVar14 = GetForegroundDrawList();
        if (*local_1c8 < 6) {
          buf._0_16_ = (undefined1  [16])
                       ShowMetricsWindow::Funcs::GetTableRect(pIVar20,*local_1c8,-1);
          ImDrawList::AddRect(pIVar14,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0xf,1.0);
        }
        else {
          for (iVar26 = 0; iVar26 < pIVar20->ColumnsCount; iVar26 = iVar26 + 1) {
            buf._0_16_ = (undefined1  [16])
                         ShowMetricsWindow::Funcs::GetTableRect(pIVar20,*local_1c8,iVar26);
            bVar13 = iVar26 == pIVar20->HoveredColumnBody;
            col = 0xff8000ff;
            if (bVar13) {
              col = 0xff80ffff;
            }
            ImDrawList::AddRect(pIVar14,(ImVec2 *)buf,(ImVec2 *)(buf + 8),col,0.0,-1,
                                *(float *)(&DAT_0017c2fc + (ulong)bVar13 * 4));
          }
        }
      }
    }
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!Begin("Dear ImGui Metrics/Debugger", p_open))
    {
        End();
        return;
    }

    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    Text("%d active allocations", io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Button("Item Picker.."))
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.GetByIndex(table_n);
                if (table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        TreePop();
    }

    // Windows
    DebugNodeWindowsList(&g.Windows, "Windows");
    //DebugNodeWindowsList(&g.WindowsFocusOrder, "WindowsFocusOrder");

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetSize()))
    {
        for (int n = 0; n < g.TabBars.GetSize(); n++)
            DebugNodeTabBar(g.TabBars.GetByIndex(n), "TabBar");
        TreePop();
    }

    // Details for Tables
#ifdef IMGUI_HAS_TABLE
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetSize()))
    {
        for (int n = 0; n < g.Tables.GetSize(); n++)
            DebugNodeTable(g.Tables.GetByIndex(n));
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_TABLE

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_TABLE
        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);

        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

#ifdef IMGUI_HAS_TABLE
    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.GetByIndex(table_n);
            if (table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, ~0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}